

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
glu::getExtensions_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,glu *this,Functions *gl,ApiType apiType)

{
  Profile PVar1;
  int iVar2;
  deBool dVar3;
  deUint32 dVar4;
  TestError *pTVar5;
  char *pcVar6;
  reference this_00;
  char *ext;
  int ndx;
  allocator<char> local_59;
  int numExtensions;
  char *local_38;
  char *extStr;
  glu *local_20;
  Functions *gl_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_10;
  ApiType apiType_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extensions;
  
  gl_local._4_4_ = SUB84(gl,0);
  local_20 = this;
  pvStack_10 = __return_storage_ptr__;
  PVar1 = ApiType::getProfile((ApiType *)((long)&gl_local + 4));
  if ((PVar1 == PROFILE_ES) &&
     (iVar2 = ApiType::getMajorVersion((ApiType *)((long)&gl_local + 4)), iVar2 == 2)) {
    do {
      dVar3 = ::deGetFalse();
      if ((dVar3 != 0) || (*(long *)(local_20 + 0xa78) == 0)) {
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,(char *)0x0,"gl.getString",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                   ,0xbf);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    local_38 = (char *)(**(code **)(local_20 + 0xa78))(0x1f03);
    dVar4 = (**(code **)(local_20 + 0x800))();
    checkError(dVar4,"glGetString(GL_EXTENSIONS)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
               ,0xc2);
    pcVar6 = local_38;
    if (local_38 == (char *)0x0) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"glGetString(GL_EXTENSIONS) returned null pointer",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                 ,199);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&numExtensions,pcVar6,&local_59);
    de::splitString(__return_storage_ptr__,(string *)&numExtensions,'\0');
    std::__cxx11::string::~string((string *)&numExtensions);
    std::allocator<char>::~allocator(&local_59);
  }
  else {
    ndx = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__);
    do {
      dVar3 = ::deGetFalse();
      if (((dVar3 != 0) || (*(long *)(local_20 + 0x868) == 0)) || (*(long *)(local_20 + 0xa80) == 0)
         ) {
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,(char *)0x0,"gl.getIntegerv && gl.getStringi",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                   ,0xce);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    (**(code **)(local_20 + 0x868))(0x821d,&ndx);
    dVar4 = (**(code **)(local_20 + 0x800))();
    checkError(dVar4,"glGetIntegerv(GL_NUM_EXTENSIONS)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
               ,0xd1);
    if (0 < ndx) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(__return_storage_ptr__,(long)ndx);
      for (ext._0_4_ = 0; (int)ext < ndx; ext._0_4_ = (int)ext + 1) {
        pcVar6 = (char *)(**(code **)(local_20 + 0xa80))(0x1f03,(int)ext);
        dVar4 = (**(code **)(local_20 + 0x800))();
        checkError(dVar4,"glGetStringi(GL_EXTENSIONS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                   ,0xda);
        if (pcVar6 == (char *)0x0) {
          pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar5,"glGetStringi(GL_EXTENSIONS) returned null pointer",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                     ,0xdf);
          __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        this_00 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](__return_storage_ptr__,(long)(int)ext);
        std::__cxx11::string::operator=((string *)this_00,pcVar6);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::string> getExtensions (const glw::Functions& gl, ApiType apiType)
{
	using std::vector;
	using std::string;

	if (apiType.getProfile() == PROFILE_ES && apiType.getMajorVersion() == 2)
	{
		TCU_CHECK(gl.getString);

		const char*	extStr	= (const char*)gl.getString(GL_EXTENSIONS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetString(GL_EXTENSIONS)");

		if (extStr)
			return de::splitString(extStr);
		else
			throw tcu::TestError("glGetString(GL_EXTENSIONS) returned null pointer", DE_NULL, __FILE__, __LINE__);
	}
	else
	{
		int				numExtensions	= 0;
		vector<string>	extensions;

		TCU_CHECK(gl.getIntegerv && gl.getStringi);

		gl.getIntegerv(GL_NUM_EXTENSIONS, &numExtensions);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv(GL_NUM_EXTENSIONS)");

		if (numExtensions > 0)
		{
			extensions.resize(numExtensions);

			for (int ndx = 0; ndx < numExtensions; ndx++)
			{
				const char* const ext = (const char*)gl.getStringi(GL_EXTENSIONS, ndx);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetStringi(GL_EXTENSIONS)");

				if (ext)
					extensions[ndx] = ext;
				else
					throw tcu::TestError("glGetStringi(GL_EXTENSIONS) returned null pointer", DE_NULL, __FILE__, __LINE__);
			}

		}

		return extensions;
	}
}